

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

int Extra_ThreshSelectWeights(word *t,int nVars,int *pW)

{
  uint uVar1;
  int iVar2;
  
  if (2 < nVars) {
    switch(nVars) {
    case 3:
      iVar2 = Extra_ThreshSelectWeights3(t,3,pW);
      return iVar2;
    case 4:
      iVar2 = Extra_ThreshSelectWeights4(t,4,pW);
      return iVar2;
    case 5:
      iVar2 = Extra_ThreshSelectWeights5(t,5,pW);
      return iVar2;
    case 6:
      iVar2 = Extra_ThreshSelectWeights6(t,6,pW);
      return iVar2;
    case 7:
      iVar2 = Extra_ThreshSelectWeights7(t,7,pW);
      return iVar2;
    case 8:
      iVar2 = Extra_ThreshSelectWeights8(t,8,pW);
      return iVar2;
    default:
      return 0;
    }
  }
  uVar1 = (uint)*t & 0xf;
  return (int)(uVar1 != 9 && uVar1 != 6);
}

Assistant:

int Extra_ThreshSelectWeights(word * t, int nVars, int * pW) {
	if (nVars <= 2)
		return (t[0] & 0xF) != 6 && (t[0] & 0xF) != 9;
	if (nVars == 3)
		return Extra_ThreshSelectWeights3(t, nVars, pW);
	if (nVars == 4)
		return Extra_ThreshSelectWeights4(t, nVars, pW);
	if (nVars == 5)
		return Extra_ThreshSelectWeights5(t, nVars, pW);
	if (nVars == 6)
		return Extra_ThreshSelectWeights6(t, nVars, pW);
	if (nVars == 7)
		return Extra_ThreshSelectWeights7(t, nVars, pW);
	if (nVars == 8)
		return Extra_ThreshSelectWeights8(t, nVars, pW);
	return 0;
}